

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

void ggml_set_i32_nd(ggml_tensor *tensor,int i0,int i1,int i2,int i3,int32_t value)

{
  ggml_type gVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  ushort uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  
  lVar4 = (long)i3 * tensor->nb[3];
  pvVar2 = tensor->data;
  gVar1 = tensor->type;
  lVar3 = (long)i2 * tensor->nb[2] + (long)i1 * tensor->nb[1] + (long)i0 * tensor->nb[0];
  auVar7._4_12_ = in_ZMM0._4_12_;
  switch(gVar1) {
  case GGML_TYPE_I8:
    *(char *)((long)pvVar2 + lVar4 + lVar3) = (char)value;
    return;
  case GGML_TYPE_I16:
    *(short *)((long)pvVar2 + lVar4 + lVar3) = (short)value;
    return;
  case GGML_TYPE_I32:
    *(int32_t *)((long)pvVar2 + lVar4 + lVar3) = value;
    return;
  case GGML_TYPE_I64:
  case GGML_TYPE_F64:
  case GGML_TYPE_IQ1_M:
    goto switchD_0010cd54_caseD_1b;
  case GGML_TYPE_BF16:
    fVar6 = (float)value;
    if ((uint)ABS(fVar6) < 0x7f800001) {
      uVar5 = (ushort)((int)fVar6 + 0x7fff + ((uint)fVar6 >> 0x10 & 1) >> 0x10);
    }
    else {
      uVar5 = (ushort)((uint)fVar6 >> 0x10) | 0x40;
    }
    *(ushort *)((long)pvVar2 + lVar4 + lVar3) = uVar5;
    return;
  default:
    if (gVar1 == GGML_TYPE_F32) {
      *(float *)((long)pvVar2 + lVar4 + lVar3) = (float)value;
      return;
    }
    if (gVar1 == GGML_TYPE_F16) {
      auVar7._0_4_ = (float)value;
      auVar7 = vcvtps2ph_f16c(auVar7,0);
      vpextrw_avx(auVar7,0);
      return;
    }
switchD_0010cd54_caseD_1b:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x40c,"fatal error");
  }
}

Assistant:

void ggml_set_i32_nd(const struct ggml_tensor * tensor, int i0, int i1, int i2, int i3, int32_t value) {
    void * data   = (char *) tensor->data + i0*tensor->nb[0] + i1*tensor->nb[1] + i2*tensor->nb[2] + i3*tensor->nb[3];
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                ((int8_t *)(data))[0] = value;
            } break;
        case GGML_TYPE_I16:
            {
                ((int16_t *)(data))[0] = value;
            } break;
        case GGML_TYPE_I32:
            {
                ((int32_t *)(data))[0] = value;
            } break;
        case GGML_TYPE_F16:
            {
                ((ggml_fp16_t *)(data))[0] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_BF16:
            {
                ((ggml_bf16_t *)(data))[0] = GGML_FP32_TO_BF16(value);
            } break;
        case GGML_TYPE_F32:
            {
                ((float *)(data))[0] = value;
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}